

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx_string.hpp
# Opt level: O0

cx_string<58UL> *
mserialize::cx_strcat<9ul,2ul,24ul,2ul,12ul,3ul,1ul,3ul,1ul,1ul>
          (cx_string<9UL> *strings,cx_string<2UL> *strings_1,cx_string<24UL> *strings_2,
          cx_string<2UL> *strings_3,cx_string<12UL> *strings_4,cx_string<3UL> *strings_5,
          cx_string<1UL> *strings_6,cx_string<3UL> *strings_7,cx_string<1UL> *strings_8,
          cx_string<1UL> *strings_9)

{
  cx_string<24UL> *in_RCX;
  cx_string<2UL> *in_RDX;
  cx_string<9UL> *in_RSI;
  cx_string<58UL> *in_RDI;
  cx_string<2UL> *in_R8;
  cx_string<12UL> *in_R9;
  cx_string<3UL> *in_stack_00000008;
  cx_string<1UL> *in_stack_00000010;
  size_t s;
  size_t i;
  char *out;
  size_t size [11];
  char *data [11];
  char buffer [59];
  char *in_stack_fffffffffffffec0;
  ulong local_138;
  char *local_130;
  size_t local_120 [11];
  char *local_c8;
  data_ref local_c0;
  data_ref local_b8;
  data_ref local_b0;
  data_ref local_a8;
  data_ref local_a0;
  data_ref local_98;
  data_ref local_90;
  data_ref local_88;
  data_ref local_80;
  data_ref local_78;
  char local_68 [64];
  cx_string<12UL> *local_28;
  cx_string<2UL> *local_20;
  cx_string<24UL> *local_18;
  cx_string<2UL> *local_10;
  cx_string<9UL> *local_8;
  
  local_28 = in_R9;
  local_20 = in_R8;
  local_18 = in_RCX;
  local_10 = in_RDX;
  local_8 = in_RSI;
  memset(local_68,0,0x3b);
  local_c8 = "";
  local_c0 = cx_string<9UL>::data(local_8);
  local_b8 = cx_string<2UL>::data(local_10);
  local_b0 = cx_string<24UL>::data(local_18);
  local_a8 = cx_string<2UL>::data(local_20);
  local_a0 = cx_string<12UL>::data(local_28);
  local_98 = cx_string<3UL>::data(in_stack_00000008);
  local_90 = cx_string<1UL>::data(in_stack_00000010);
  local_88 = cx_string<3UL>::data((cx_string<3UL> *)s);
  local_80 = cx_string<1UL>::data((cx_string<1UL> *)i);
  local_78 = cx_string<1UL>::data((cx_string<1UL> *)out);
  local_120[0] = cx_string<9UL>::size(local_8);
  local_120[1] = cx_string<2UL>::size(local_10);
  local_120[2] = cx_string<24UL>::size(local_18);
  local_120[3] = cx_string<2UL>::size(local_20);
  local_120[4] = cx_string<12UL>::size(local_28);
  local_120[5] = cx_string<3UL>::size(in_stack_00000008);
  local_120[6] = cx_string<1UL>::size(in_stack_00000010);
  local_120[7] = cx_string<3UL>::size((cx_string<3UL> *)s);
  local_120[8] = cx_string<1UL>::size((cx_string<1UL> *)i);
  local_120[9] = cx_string<1UL>::size((cx_string<1UL> *)out);
  local_130 = local_68;
  for (local_138 = 1; local_138 < 0xb; local_138 = local_138 + 1) {
    for (in_stack_fffffffffffffec0 = (char *)0x0;
        in_stack_fffffffffffffec0 < (cx_string<58UL> *)local_120[local_138 - 1];
        in_stack_fffffffffffffec0 = in_stack_fffffffffffffec0 + 1) {
      *local_130 = in_stack_fffffffffffffec0[(long)(&local_c8)[local_138]];
      local_130 = local_130 + 1;
    }
  }
  cx_string<58UL>::cx_string((cx_string<58UL> *)in_stack_fffffffffffffec0,in_RDI->_data);
  return in_RDI;
}

Assistant:

constexpr auto cx_strcat(const cx_string<N>&&... strings)
{
  char buffer[detail::sum<N...>()+1] = {0};
  const char* data[] = {"", strings.data()...};
  const std::size_t size[] = {0, strings.size()...};

  char* out = buffer;
  for (std::size_t i = 1; i <= sizeof...(N); ++i)
  {
    for (std::size_t s = 0; s < size[i]; ++s) { *out++ = data[i][s]; } // NOLINT
  }

  return cx_string<sizeof(buffer)-1>(buffer);
}